

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-utils.cc
# Opt level: O0

File __thiscall mp::NLUtils::openf(NLUtils *this,string *fname,int Close,char *mode)

{
  bool bVar1;
  byte bVar2;
  char *__filename;
  undefined8 uVar3;
  int in_ECX;
  long *in_RSI;
  FILE *in_RDI;
  File *f;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  FILE *this_00;
  
  this_00 = in_RDI;
  File::File((File *)in_RDI);
  if (in_ECX == 0) {
    std::__cxx11::string::c_str();
    File::Open((File *)this_00,(char *)in_RDI,
               (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
    bVar1 = File::operator_cast_to_bool((File *)in_RDI);
    if (bVar1) {
      bVar2 = (**(code **)(*in_RSI + 0x28))();
      if ((bVar2 & 1) != 0) {
        uVar3 = std::__cxx11::string::c_str();
        (**(code **)(*in_RSI + 0x18))(in_RSI,"File %s\n",uVar3);
      }
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      (**(code **)(*in_RSI + 0x20))(in_RSI,"can\'t open %s",uVar3);
    }
  }
  else {
    __filename = (char *)std::__cxx11::string::c_str();
    remove(__filename);
  }
  return (File)this_00;
}

Assistant:

File NLUtils::
openf(const std::string& fname, int Close, const char *mode)
{
  File f;
  if (Close) {
    std::remove(fname.c_str());
    return f;
  }
  f.Open(fname.c_str(), mode);
  if (!f) {
    log_warning("can't open %s", fname.c_str());
    return f;
  }
  if (if_show_filenames())
    log_message("File %s\n", fname.c_str());
  return f;
}